

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::VarintTest_TestReadUnsigned64_Test::~VarintTest_TestReadUnsigned64_Test
          (VarintTest_TestReadUnsigned64_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestReadUnsigned64)
{
    ByteBuffer buffer00 = HexEncoderDecoder::HexStream("00");
    ByteBuffer buffer01 = HexEncoderDecoder::HexStream("01");
    ByteBuffer buffer02 = HexEncoderDecoder::HexStream("02");
    ByteBuffer buffer16 = HexEncoderDecoder::HexStream("10");
    ByteBuffer buffer127 = HexEncoderDecoder::HexStream("7f");
    ByteBuffer buffer128 = HexEncoderDecoder::HexStream("8001");
    ByteBuffer buffer129 = HexEncoderDecoder::HexStream("8101");
    ByteBuffer buffer130 = HexEncoderDecoder::HexStream("8201");
    ByteBuffer buffer65535 = HexEncoderDecoder::HexStream("ffff03");

    ASSERT_EQ(0, Varint::ReadU64(buffer00));
    ASSERT_EQ(1, Varint::ReadU64(buffer01));
    ASSERT_EQ(2, Varint::ReadU64(buffer02));
    ASSERT_EQ(16, Varint::ReadU64(buffer16));
    ASSERT_EQ(127, Varint::ReadU64(buffer127));

    ASSERT_EQ(128, Varint::ReadU64(buffer128));
    ASSERT_EQ(129, Varint::ReadU64(buffer129));
    ASSERT_EQ(130, Varint::ReadU64(buffer130));
    ASSERT_EQ(65535, Varint::ReadU64(buffer65535)); // Endianness might affect his test!!
}